

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

void __thiscall gutil::Properties::putValue<int>(Properties *this,char *key,int *value)

{
  ostringstream out;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,*value);
  std::__cxx11::stringbuf::str();
  putString(this,key,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }